

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O1

void undo_perm32(uchar *mat,int *P,int n)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 uVar5;
  uchar *puVar6;
  undefined4 uVar7;
  ulong uVar8;
  ulong uVar9;
  uchar *puVar10;
  int j;
  ulong uVar11;
  
  if (0 < n) {
    uVar3 = (uint)n >> 5;
    uVar4 = (ulong)(uint)n;
    puVar6 = mat + (uVar4 - 1) * (ulong)uVar3 * 4;
    uVar8 = uVar4;
    do {
      uVar11 = 0;
      puVar10 = mat;
      do {
        if (0x1f < (uint)n) {
          uVar1 = P[uVar8 - 1];
          uVar9 = 0;
          do {
            uVar5 = *(undefined4 *)(puVar6 + uVar9 * 4);
            uVar7 = *(undefined4 *)(puVar10 + uVar9 * 4);
            if (uVar11 != uVar1) {
              uVar7 = uVar5;
            }
            *(undefined4 *)(puVar6 + uVar9 * 4) = uVar7;
            if (uVar11 != uVar1) {
              uVar5 = *(undefined4 *)(puVar10 + uVar9 * 4);
            }
            *(undefined4 *)(puVar10 + uVar9 * 4) = uVar5;
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
        uVar11 = uVar11 + 1;
        puVar10 = puVar10 + (uVar3 << 2);
      } while (uVar11 != uVar4);
      puVar6 = puVar6 + -(ulong)(uVar3 << 2);
      bVar2 = 1 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void undo_perm32(unsigned char *mat, int *P, int n)
{
  uint32_t mask_cpy;
  uint32_t tmp;
  uint32_t *mat_32_ptr = (uint32_t*)mat;

  for(int i = n-1; i >= 0; i--)
  {
    for(int j = 0; j < n; j++)
    {
      mask_cpy = (j == P[i]);
      mask_cpy = -mask_cpy;

      for(int c = 0; c < n/32; c++)
      {
        tmp = mat_32_ptr[(n/32)*i + c];
        mat_32_ptr[(n/32)*i + c] = (mat_32_ptr[(n/32)*i + c] & ~mask_cpy) | (mat_32_ptr[(n/32)*j + c] & mask_cpy);
        mat_32_ptr[(n/32)*j + c] = (mat_32_ptr[(n/32)*j + c] & ~mask_cpy) | (tmp & mask_cpy);
      }
    }
  }
}